

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_utils.h
# Opt level: O2

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
Gudhi::read_persistence_intervals_in_dimension
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Gudhi *this,string *filename,int only_this_dim)

{
  undefined4 in_register_0000000c;
  function_output_iterator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_common_include_gudhi_reader_utils_h:359:54)>
  out;
  
  out.m_f.ret._4_4_ = in_register_0000000c;
  out.m_f.ret._0_4_ = only_this_dim;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out.m_f._0_8_ = __return_storage_ptr__;
  read_persistence_intervals_and_dimension<boost::iterators::function_output_iterator<Gudhi::read_persistence_intervals_in_dimension(std::__cxx11::string_const&,int)::_lambda(std::tuple<int,double,double>)_1_>>
            (this,(string *)((ulong)filename & 0xffffffff),out);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::pair<double, double>> read_persistence_intervals_in_dimension(std::string const& filename,
                                                                                      int only_this_dim = -1) {
  std::vector<std::pair<double, double>> ret;
  read_persistence_intervals_and_dimension(
      filename, boost::make_function_output_iterator([only_this_dim, &ret](std::tuple<int, double, double> t) {
        if (only_this_dim == get<0>(t) || only_this_dim == -1) ret.emplace_back(get<1>(t), get<2>(t));
      }));
  return ret;
}